

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_SubDEdge::ControlNetDirectionFrom
          (ON_3dVector *__return_storage_ptr__,ON_SubDEdge *this,ON_SubDVertex *v)

{
  ON_3dVector local_30;
  ON_SubDVertex *local_18;
  ON_SubDVertex *v_local;
  ON_SubDEdge *this_local;
  
  if (v != (ON_SubDVertex *)0x0) {
    local_18 = v;
    v_local = (ON_SubDVertex *)this;
    if ((v == this->m_vertex[0]) && (this->m_vertex[1] != (ON_SubDVertex *)0x0)) {
      ControlNetDirection(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    }
    if ((v == this->m_vertex[1]) && (this->m_vertex[0] != (ON_SubDVertex *)0x0)) {
      ControlNetDirection(&local_30,this);
      ON_3dVector::operator-(__return_storage_ptr__,&local_30);
      return __return_storage_ptr__;
    }
  }
  __return_storage_ptr__->x = ON_3dVector::NanVector.x;
  __return_storage_ptr__->y = ON_3dVector::NanVector.y;
  __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDEdge::ControlNetDirectionFrom(
  const ON_SubDVertex* v
) const
{
  if (nullptr != v)
  {
    if (v == m_vertex[0] && nullptr != m_vertex[1])
      return ControlNetDirection();
    if (v == m_vertex[1] && nullptr != m_vertex[0])
      return -ControlNetDirection();
  }
  return ON_3dVector::NanVector;
}